

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::Matrix::mult_(Matrix *dst,Matrix *src1,Matrix *src2)

{
  Matrix *src2_local;
  Matrix *src1_local;
  Matrix *dst_local;
  
  (dst->right).x =
       (float32)((float)(src1->right).z * (float)(src2->at).x +
                (float)(src1->right).x * (float)(src2->right).x +
                (float)(src1->right).y * (float)(src2->up).x);
  (dst->right).y =
       (float32)((float)(src1->right).z * (float)(src2->at).y +
                (float)(src1->right).x * (float)(src2->right).y +
                (float)(src1->right).y * (float)(src2->up).y);
  (dst->right).z =
       (float32)((float)(src1->right).z * (float)(src2->at).z +
                (float)(src1->right).x * (float)(src2->right).z +
                (float)(src1->right).y * (float)(src2->up).z);
  (dst->up).x = (float32)((float)(src1->up).z * (float)(src2->at).x +
                         (float)(src1->up).x * (float)(src2->right).x +
                         (float)(src1->up).y * (float)(src2->up).x);
  (dst->up).y = (float32)((float)(src1->up).z * (float)(src2->at).y +
                         (float)(src1->up).x * (float)(src2->right).y +
                         (float)(src1->up).y * (float)(src2->up).y);
  (dst->up).z = (float32)((float)(src1->up).z * (float)(src2->at).z +
                         (float)(src1->up).x * (float)(src2->right).z +
                         (float)(src1->up).y * (float)(src2->up).z);
  (dst->at).x = (float32)((float)(src1->at).z * (float)(src2->at).x +
                         (float)(src1->at).x * (float)(src2->right).x +
                         (float)(src1->at).y * (float)(src2->up).x);
  (dst->at).y = (float32)((float)(src1->at).z * (float)(src2->at).y +
                         (float)(src1->at).x * (float)(src2->right).y +
                         (float)(src1->at).y * (float)(src2->up).y);
  (dst->at).z = (float32)((float)(src1->at).z * (float)(src2->at).z +
                         (float)(src1->at).x * (float)(src2->right).z +
                         (float)(src1->at).y * (float)(src2->up).z);
  (dst->pos).x = (float32)((float)(src1->pos).z * (float)(src2->at).x +
                           (float)(src1->pos).x * (float)(src2->right).x +
                           (float)(src1->pos).y * (float)(src2->up).x + (float)(src2->pos).x);
  (dst->pos).y = (float32)((float)(src1->pos).z * (float)(src2->at).y +
                           (float)(src1->pos).x * (float)(src2->right).y +
                           (float)(src1->pos).y * (float)(src2->up).y + (float)(src2->pos).y);
  (dst->pos).z = (float32)((float)(src1->pos).z * (float)(src2->at).z +
                           (float)(src1->pos).x * (float)(src2->right).z +
                           (float)(src1->pos).y * (float)(src2->up).z + (float)(src2->pos).z);
  return;
}

Assistant:

void
Matrix::mult_(Matrix *dst, const Matrix *src1, const Matrix *src2)
{
	dst->right.x = src1->right.x*src2->right.x + src1->right.y*src2->up.x + src1->right.z*src2->at.x;
	dst->right.y = src1->right.x*src2->right.y + src1->right.y*src2->up.y + src1->right.z*src2->at.y;
	dst->right.z = src1->right.x*src2->right.z + src1->right.y*src2->up.z + src1->right.z*src2->at.z;
	dst->up.x    = src1->up.x*src2->right.x    + src1->up.y*src2->up.x    + src1->up.z*src2->at.x;
	dst->up.y    = src1->up.x*src2->right.y    + src1->up.y*src2->up.y    + src1->up.z*src2->at.y;
	dst->up.z    = src1->up.x*src2->right.z    + src1->up.y*src2->up.z    + src1->up.z*src2->at.z;
	dst->at.x    = src1->at.x*src2->right.x    + src1->at.y*src2->up.x    + src1->at.z*src2->at.x;
	dst->at.y    = src1->at.x*src2->right.y    + src1->at.y*src2->up.y    + src1->at.z*src2->at.y;
	dst->at.z    = src1->at.x*src2->right.z    + src1->at.y*src2->up.z    + src1->at.z*src2->at.z;
	dst->pos.x   = src1->pos.x*src2->right.x   + src1->pos.y*src2->up.x   + src1->pos.z*src2->at.x + src2->pos.x;
	dst->pos.y   = src1->pos.x*src2->right.y   + src1->pos.y*src2->up.y   + src1->pos.z*src2->at.y + src2->pos.y;
	dst->pos.z   = src1->pos.x*src2->right.z   + src1->pos.y*src2->up.z   + src1->pos.z*src2->at.z + src2->pos.z;
}